

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_std::utf8_moneypunct_from_wide<false>::utf8_moneypunct_from_wide
          (utf8_moneypunct_from_wide<false> *this,locale *base,size_t refs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  moneypunct *pmVar7;
  bool bVar8;
  string tmp_grouping;
  wchar_t *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  string local_a8;
  string *local_88;
  string *local_80;
  string *local_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  std::__cxx11::moneypunct<char,false>::moneypunct((ulong)this);
  *(undefined ***)this = &PTR__utf8_moneypunct_from_wide_001d2fa8;
  local_38 = &(this->grouping_).field_2;
  (this->grouping_)._M_dataplus._M_p = (pointer)local_38;
  (this->grouping_)._M_string_length = 0;
  (this->grouping_).field_2._M_local_buf[0] = '\0';
  local_78 = (string *)&this->curr_symbol_;
  local_40 = &(this->curr_symbol_).field_2;
  (this->curr_symbol_)._M_dataplus._M_p = (pointer)local_40;
  (this->curr_symbol_)._M_string_length = 0;
  (this->curr_symbol_).field_2._M_local_buf[0] = '\0';
  local_80 = (string *)&this->positive_sign_;
  local_48 = &(this->positive_sign_).field_2;
  (this->positive_sign_)._M_dataplus._M_p = (pointer)local_48;
  (this->positive_sign_)._M_string_length = 0;
  (this->positive_sign_).field_2._M_local_buf[0] = '\0';
  local_88 = (string *)&this->negative_sign_;
  local_50 = &(this->negative_sign_).field_2;
  (this->negative_sign_)._M_dataplus._M_p = (pointer)local_50;
  (this->negative_sign_)._M_string_length = 0;
  (this->negative_sign_).field_2._M_local_buf[0] = '\0';
  pmVar7 = std::use_facet<std::__cxx11::moneypunct<wchar_t,false>>(base);
  (**(code **)(*(long *)pmVar7 + 0x28))(&local_c8,pmVar7);
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"UTF-8","");
  conv::from_utf<wchar_t>(&local_70,local_c8,local_c8 + local_c0,&local_a8,default_method);
  std::__cxx11::string::operator=(local_78,(string *)&local_70);
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_c8 != (wchar_t *)local_b8) {
    operator_delete(local_c8);
  }
  (**(code **)(*(long *)pmVar7 + 0x30))(&local_c8,pmVar7);
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"UTF-8","");
  conv::from_utf<wchar_t>(&local_70,local_c8,local_c8 + local_c0,&local_a8,default_method);
  std::__cxx11::string::operator=(local_80,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_c8 != (wchar_t *)local_b8) {
    operator_delete(local_c8);
  }
  (**(code **)(*(long *)pmVar7 + 0x38))(&local_c8,pmVar7);
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"UTF-8","");
  conv::from_utf<wchar_t>(&local_70,local_c8,local_c8 + local_c0,&local_a8,default_method);
  std::__cxx11::string::operator=(local_88,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_c8 != (wchar_t *)local_b8) {
    operator_delete(local_c8);
  }
  iVar3 = (**(code **)(*(long *)pmVar7 + 0x40))(pmVar7);
  this->frac_digits_ = iVar3;
  uVar4 = (**(code **)(*(long *)pmVar7 + 0x48))(pmVar7);
  *(undefined4 *)(this->pos_format_).field = uVar4;
  uVar4 = (**(code **)(*(long *)pmVar7 + 0x50))(pmVar7);
  *(undefined4 *)(this->neg_format_).field = uVar4;
  iVar3 = (**(code **)(*(long *)pmVar7 + 0x10))(pmVar7);
  iVar5 = (**(code **)(*(long *)pmVar7 + 0x18))(pmVar7);
  (**(code **)(*(long *)pmVar7 + 0x20))(&local_70,pmVar7);
  uVar6 = iVar3 - 0x20;
  if (((uVar6 < 0x5f) && (iVar5 - 0x20U < 0x5f)) ||
     (bVar8 = iVar5 == 0xa0, iVar5 = 0x20, bVar8 && uVar6 < 0x5f)) {
    this->thousands_sep_ = (char)iVar5;
    this->decimal_point_ = (char)iVar3;
    std::__cxx11::string::_M_assign((string *)&this->grouping_);
  }
  else {
    this->thousands_sep_ = ',';
    if (uVar6 < 0x5f) {
      this->decimal_point_ = (char)iVar3;
    }
    else {
      this->decimal_point_ = '.';
    }
    local_c0 = 0;
    local_b8[0] = 0;
    local_c8 = (wchar_t *)local_b8;
    std::__cxx11::string::operator=((string *)&this->grouping_,(string *)&local_c8);
    if (local_c8 != (wchar_t *)local_b8) {
      operator_delete(local_c8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

utf8_moneypunct_from_wide(std::locale const &base,size_t refs = 0) : std::moneypunct<char,Intl>(refs)
    {
        typedef std::moneypunct<wchar_t,Intl> wfacet_type;
        wfacet_type const &wfacet = std::use_facet<wfacet_type>(base);

        curr_symbol_ = conv::from_utf<wchar_t>(wfacet.curr_symbol(),"UTF-8");
        positive_sign_ = conv::from_utf<wchar_t>(wfacet.positive_sign(),"UTF-8");
        negative_sign_ = conv::from_utf<wchar_t>(wfacet.negative_sign(),"UTF-8");
        frac_digits_ = wfacet.frac_digits();
        pos_format_ = wfacet.pos_format();
        neg_format_ = wfacet.neg_format();

        wchar_t tmp_decimal_point = wfacet.decimal_point();
        wchar_t tmp_thousands_sep = wfacet.thousands_sep();
        std::string tmp_grouping = wfacet.grouping();
        if( 32 <= tmp_thousands_sep && tmp_thousands_sep <=126 &&
            32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_ = static_cast<char>(tmp_thousands_sep);
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126 && tmp_thousands_sep == 0xA0) {
            // workaround common bug - substitute NBSP with ordinary space
            thousands_sep_ = ' ';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_ = tmp_grouping;
        }
        else if(32 <= tmp_decimal_point && tmp_decimal_point <=126)
        {
            thousands_sep_=',';
            decimal_point_ = static_cast<char>(tmp_decimal_point);
            grouping_=std::string();
        }
        else {
            thousands_sep_ = ',';
            decimal_point_ = '.';
            grouping_=std::string();
        }
    }